

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTPNDebugDstr::gen_code(CTPNDebugDstr *this,int param_1,int param_2)

{
  uint16_t tmp;
  size_t in_RCX;
  char buf [2];
  undefined2 local_1a;
  
  CTcGenTarg::write_op(G_cg,'\f');
  local_1a = (undefined2)(this->super_CTPNDstr).super_CTPNDstrBase.len_;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_1a,(void *)0x2,in_RCX);
  CTcDataStream::write
            (&G_cs->super_CTcDataStream,(int)(this->super_CTPNDstr).super_CTPNDstrBase.str_,
             (void *)(this->super_CTPNDstr).super_CTPNDstrBase.len_,in_RCX);
  CTcGenTarg::write_op(G_cg,0xb9);
  if (G_cg->max_sp_depth_ <= G_cg->sp_depth_) {
    G_cg->max_sp_depth_ = G_cg->sp_depth_ + 1;
  }
  return;
}

Assistant:

void CTPNDebugDstr::gen_code(int, int)
{
    /* generate code to push the in-line string */
    G_cg->write_op(OPC_PUSHSTRI);
    G_cs->write2(len_);
    G_cs->write(str_, len_);

    /* write code to display the value */
    G_cg->write_op(OPC_SAYVAL);

    /* note that we pushed the string and then popped it */
    G_cg->note_push();
    G_cg->note_pop();
}